

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void satoko_sort(void **data,uint size,_func_int_void_ptr_void_ptr *comp_fn)

{
  ulong uVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  void *pvVar5;
  clause_conflict *c2;
  uint uVar6;
  _func_int_void_ptr_void_ptr *comp_fn_00;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  void **data_00;
  clause_conflict *c1;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  
  if (0xf < size) {
LAB_0090a9d4:
    uVar8 = size;
    data_00 = data;
    puVar2 = (uint *)data_00[uVar8 >> 1];
    uVar13 = puVar2[1];
    lVar11 = -1;
    comp_fn_00 = (_func_int_void_ptr_void_ptr *)(ulong)uVar8;
    uVar9 = uVar13;
    uVar10 = uVar13;
LAB_0090a9f1:
    uVar14 = (ulong)(int)lVar11;
    while( true ) {
      lVar11 = ~uVar14 << 3;
      do {
        lVar16 = lVar11;
        uVar7 = uVar14;
        puVar3 = (uint *)data_00[uVar7 + 1];
        uVar6 = puVar3[1];
        if ((ulong)uVar6 < 3) {
          if ((uVar6 == 2) && (1 < uVar10)) goto LAB_0090aa66;
        }
        else {
          uVar10 = uVar9;
          if (uVar9 == 2) {
            uVar9 = 2;
            goto LAB_0090aa58;
          }
        }
        uVar17 = *puVar3 >> 4;
        uVar18 = *puVar2 >> 4;
        uVar14 = uVar7 + 1;
        lVar11 = lVar16 + -8;
      } while (uVar17 >= uVar18 && uVar17 != uVar18);
      if ((uVar17 < uVar18) ||
         (uVar9 = uVar13, uVar10 = uVar13, puVar2[(ulong)uVar13 + 2] <= puVar3[(ulong)uVar6 + 2]))
      break;
LAB_0090aa58:
      uVar14 = uVar7 + 1;
      uVar10 = uVar9;
    }
LAB_0090aa66:
    lVar11 = uVar7 + 1;
LAB_0090aa6a:
    do {
      uVar6 = (int)comp_fn_00 - 1;
      comp_fn_00 = (_func_int_void_ptr_void_ptr *)(ulong)uVar6;
      puVar4 = (uint *)data_00[uVar6];
      if (uVar13 < 3) {
        if ((uVar13 == 2) && (1 < puVar4[1])) goto LAB_0090aab2;
      }
      else if (puVar4[1] == 2) goto LAB_0090aa6a;
      if ((*puVar2 >> 4 <= *puVar4 >> 4) &&
         ((*puVar2 >> 4 < *puVar4 >> 4 ||
          (puVar4[(ulong)puVar4[1] + 2] <= puVar2[(ulong)uVar13 + 2])))) goto LAB_0090aab2;
    } while( true );
  }
LAB_0090aaf6:
  if (size - 1 != 0) {
    uVar7 = 1;
    uVar14 = 0;
    do {
      uVar1 = uVar14 + 1;
      if (uVar1 < size) {
        uVar15 = uVar14 & 0xffffffff;
        uVar12 = uVar7;
        do {
          puVar2 = (uint *)data[uVar12];
          puVar3 = (uint *)data[uVar15];
          uVar13 = puVar2[1];
          if ((ulong)uVar13 < 3) {
            if ((uVar13 != 2) || (puVar3[1] < 2)) goto LAB_0090ab43;
          }
          else {
            if (puVar3[1] != 2) {
LAB_0090ab43:
              if ((*puVar2 >> 4 <= *puVar3 >> 4) &&
                 ((*puVar2 >> 4 < *puVar3 >> 4 ||
                  (puVar3[(ulong)puVar3[1] + 2] <= puVar2[(ulong)uVar13 + 2])))) goto LAB_0090ab58;
            }
            uVar15 = uVar12 & 0xffffffff;
          }
LAB_0090ab58:
          uVar13 = (uint)uVar15;
          uVar12 = uVar12 + 1;
        } while (size != (uint)uVar12);
      }
      else {
        uVar13 = (uint)uVar14;
      }
      pvVar5 = data[uVar14];
      data[uVar14] = data[uVar13];
      data[uVar13] = pvVar5;
      uVar7 = uVar7 + 1;
      uVar14 = uVar1;
    } while (uVar1 != size - 1);
  }
  return;
LAB_0090aab2:
  if (uVar6 <= (uint)lVar11) goto LAB_0090aac5;
  data_00[uVar7 + 1] = puVar4;
  data_00[uVar6] = puVar3;
  goto LAB_0090a9f1;
LAB_0090aac5:
  uVar13 = (uint)uVar7;
  satoko_sort(data_00,uVar13 + 1,comp_fn_00);
  data = (void **)((long)data_00 - lVar16);
  size = ~uVar13 + uVar8;
  if (~uVar13 + uVar8 < 0x10) goto code_r0x0090aae7;
  goto LAB_0090a9d4;
code_r0x0090aae7:
  data = (void **)((long)data_00 - lVar16);
  size = ~uVar13 + uVar8;
  goto LAB_0090aaf6;
}

Assistant:

static void satoko_sort(void **data, unsigned size,
            int (*comp_fn)(const void *, const void *))
{
    if (size <= 15)
        select_sort(data, size, comp_fn);
    else {
        void *pivot = data[size / 2];
        void *temp;
        unsigned j = size;
        int i = -1;

        for (;;) {
            do {
                i++;
            } while (comp_fn(data[i], pivot));
            do {
                j--;
            } while (comp_fn(pivot, data[j]));

            if ((unsigned) i >= j)
                break;

            temp = data[i];
            data[i] = data[j];
            data[j] = temp;
        }
        satoko_sort(data, (unsigned) i, comp_fn);
        satoko_sort(data + i, (size - (unsigned) i), comp_fn);
    }
}